

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int CentralBroker::logging_shutdown_pipe(zloop_t *loop,zsock_t *reader,void *arg)

{
  int iVar1;
  char *__s1;
  void *in_RSI;
  int rc;
  char *msg;
  int local_24;
  
  __s1 = zstr_recv(in_RSI);
  local_24 = 0;
  iVar1 = strcmp(__s1,"$TERM");
  if (iVar1 == 0) {
    local_24 = -1;
  }
  free(__s1);
  return local_24;
}

Assistant:

int CentralBroker::logging_shutdown_pipe(zloop_t *loop, zsock_t *reader, void *arg){
//    CentralBroker *self = (CentralBroker*)arg;
    char *msg = zstr_recv(reader);
    int rc = 0;
    if(streq(msg, "$TERM")){
        rc = -1;
    }
    freen(msg);
    return rc;
}